

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O0

int ncnn::gemm_BT_x86_int8
              (Mat *A,Mat *BT,float B_int8_scale,Mat *C,Mat *top_blob,int broadcast_type_C,int N,
              int K,int transA,int output_transpose,float alpha,float beta,int constant_TILE_M,
              int constant_TILE_N,int constant_TILE_K,int nT,Option *opt)

{
  int iVar1;
  int *piVar2;
  long *in_RSI;
  size_t in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  int in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000038;
  long in_stack_00000040;
  int in_stack_0000006c;
  int in_stack_00000070;
  int in_stack_00000074;
  Mat *in_stack_00000078;
  Mat *in_stack_00000080;
  Mat *in_stack_00000088;
  Mat BT_tile;
  Mat AT_tile;
  int max_kk;
  int k;
  int max_jj;
  int j;
  Mat topT_tile;
  int max_ii;
  int K_1;
  int M_1;
  int i;
  float beta_1;
  float alpha_1;
  int output_transpose_1;
  int transA_1;
  int broadcast_type_C_1;
  int TILE_K_1;
  int TILE_N_1;
  int TILE_M_1;
  int ppi;
  gemm_x86_int8_omp_args args;
  Mat topT;
  int w_shift_count;
  bool has_w_shift;
  Mat ATX;
  Mat output_descales;
  Mat A_int8_scales;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int M;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  int in_stack_00002100;
  int in_stack_00002108;
  int in_stack_00002110;
  Mat *pMVar3;
  float B_scale;
  undefined1 *puVar4;
  Mat *scales;
  float in_stack_fffffffffffff5f4;
  float in_stack_fffffffffffff5f8;
  int in_stack_fffffffffffff5fc;
  int in_stack_fffffffffffff600;
  int in_stack_fffffffffffff604;
  Mat *in_stack_fffffffffffff608;
  Mat *in_stack_fffffffffffff610;
  Mat *in_stack_fffffffffffff618;
  int in_stack_fffffffffffff630;
  undefined8 in_stack_fffffffffffff638;
  void **ppvVar5;
  Mat *in_stack_fffffffffffff640;
  void **in_stack_fffffffffffff648;
  int in_stack_fffffffffffff650;
  int in_stack_fffffffffffff654;
  undefined8 in_stack_fffffffffffff658;
  undefined8 in_stack_fffffffffffff660;
  int *in_stack_fffffffffffff670;
  int *in_stack_fffffffffffff678;
  int *in_stack_fffffffffffff680;
  int in_stack_fffffffffffff688;
  int local_91c;
  int local_918;
  int local_914;
  int local_910;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined4 local_8d4;
  bool local_8c5;
  int local_878;
  int local_874;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined4 local_858;
  long *local_850;
  undefined4 local_848;
  undefined4 local_844;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined8 local_830;
  void *local_828;
  int *local_820;
  long local_818;
  undefined4 local_810;
  long *local_808;
  undefined4 local_800;
  int local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  long local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined4 local_7c8;
  long *local_7c0;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined8 local_7a0;
  void *local_798;
  int *local_790;
  long local_788;
  undefined4 local_780;
  long *local_778;
  undefined4 local_770;
  int local_76c;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  long local_758;
  int local_750;
  int local_74c;
  int local_748;
  int local_744;
  int local_740;
  int local_73c;
  void *local_738;
  int *local_730;
  ulong local_728;
  undefined4 local_720;
  long *local_718;
  int local_710;
  int local_70c;
  int local_708;
  undefined4 local_704;
  undefined4 local_700;
  ulong local_6f8;
  int local_6f0;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  int local_6d0;
  undefined4 local_6cc;
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  int local_6b0;
  undefined4 local_6ac;
  int local_6a8;
  undefined4 local_6a4;
  undefined4 local_6a0;
  undefined4 local_69c;
  void *local_698;
  int *local_690;
  ulong local_688;
  undefined4 local_680;
  long *local_678;
  int local_670;
  int local_66c;
  int local_668;
  undefined4 local_664;
  int local_660;
  long local_658;
  undefined4 local_650;
  bool local_649;
  void *local_648;
  int *local_640;
  long local_638;
  undefined4 local_630;
  long *local_628;
  undefined4 local_620;
  int local_61c;
  int local_618;
  undefined4 local_614;
  int local_610;
  long local_608;
  Mat local_600;
  undefined4 local_5b8;
  Mat local_5a8;
  int local_55c;
  undefined1 local_558 [12];
  int local_54c;
  undefined4 local_548;
  undefined4 local_544;
  int local_540;
  undefined4 local_53c;
  long *local_520;
  size_t local_518;
  int local_50c;
  void **local_508;
  undefined8 *local_500;
  undefined8 *local_4f0;
  void **local_4e0;
  void **local_4d0;
  void **local_4c0;
  void **local_4b0;
  void **local_4a0;
  Mat *local_490;
  Mat *local_480;
  void **local_470;
  void **local_468;
  Mat *local_460;
  Mat *local_458;
  undefined1 local_44d;
  int local_44c;
  void **local_448;
  undefined8 *local_440;
  undefined1 local_42d;
  int local_42c;
  void **local_428;
  void **local_420;
  undefined4 local_410;
  int local_40c;
  undefined8 *local_408;
  void **local_400;
  int local_3c8;
  undefined4 local_3c4;
  Mat *local_3c0;
  int local_3a8;
  undefined4 local_3a4;
  Mat *local_3a0;
  int local_388;
  undefined4 local_384;
  void **local_380;
  int local_368;
  undefined4 local_364;
  void **local_360;
  int local_348;
  undefined4 local_344;
  void **local_340;
  int local_328;
  undefined4 local_324;
  void **local_320;
  int local_308;
  undefined4 local_304;
  void **local_300;
  undefined8 *local_2e0;
  undefined8 *local_2c0;
  Mat *local_2b8;
  Mat *local_2b0;
  void **local_2a8;
  void **local_2a0;
  long *local_298;
  undefined4 local_28c;
  ulong local_288;
  void *local_280;
  undefined4 local_274;
  int local_270;
  int local_26c;
  void **local_268;
  long *local_260;
  undefined4 local_254;
  long local_250;
  void *local_248;
  undefined4 local_23c;
  int local_238;
  int local_234;
  undefined8 *local_230;
  undefined4 local_224;
  long local_220;
  undefined4 local_214;
  long local_210;
  long *local_208;
  undefined4 local_1fc;
  long local_1f8;
  void *local_1f0;
  undefined4 local_1e8;
  int local_1e4;
  void **local_1e0;
  void *local_1b8;
  void *local_1a8;
  void *local_198;
  void *local_188;
  void *local_178;
  void *local_168;
  void *local_158;
  undefined1 local_135;
  int local_134;
  undefined8 *local_128;
  long *local_108;
  undefined4 local_fc;
  long local_f8;
  long local_f0;
  undefined4 local_e4;
  int local_e0;
  int local_dc;
  undefined8 *local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_b8;
  int local_b4;
  undefined8 *local_b0;
  void **local_a8;
  long *local_a0;
  undefined4 local_94;
  long local_90;
  void *local_88;
  undefined4 local_80;
  int local_7c;
  void **local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined4 local_58;
  int local_54;
  void **local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_34;
  Mat *local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_14;
  Mat *local_10;
  
  if (in_stack_00000010 == 0) {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_878 = *(int *)(in_RDI + 0x38);
    }
    else {
      local_878 = *(int *)(in_RDI + 0x30);
    }
    local_874 = local_878 * *(int *)(in_RDI + 0x18);
  }
  else {
    local_874 = *(int *)(in_RDI + 0x2c);
  }
  local_54c = local_874;
  pMVar3 = (Mat *)(local_558 + 8);
  puVar4 = local_558 + 4;
  scales = (Mat *)local_558;
  local_548 = in_XMM2_Da;
  local_544 = in_XMM1_Da;
  local_540 = in_R9D;
  local_53c = in_R8D;
  local_520 = in_RSI;
  local_518 = in_RDI;
  get_optimal_tile_mnk_int8
            ((int)((ulong)in_stack_fffffffffffff660 >> 0x20),(int)in_stack_fffffffffffff660,
             (int)((ulong)in_stack_fffffffffffff658 >> 0x20),(int)in_stack_fffffffffffff658,
             in_stack_fffffffffffff654,in_stack_fffffffffffff650,in_stack_fffffffffffff670,
             in_stack_fffffffffffff678,in_stack_fffffffffffff680,in_stack_fffffffffffff688);
  local_55c = (local_54c + local_558._8_4_ + -1) / (int)local_558._8_4_;
  local_48 = *(undefined8 *)(in_stack_00000040 + 0x10);
  local_30 = &local_5a8;
  local_34 = local_54c;
  local_40 = 4;
  local_5a8.data = (void *)0x0;
  local_5a8.refcount = (int *)0x0;
  local_5a8.elemsize = 0;
  local_5a8.elempack = 0;
  local_5a8.allocator = (Allocator *)0x0;
  local_5a8.dims = 0;
  local_5a8.w = 0;
  local_5a8.h = 0;
  local_5a8.d = 0;
  local_5a8.c = 0;
  local_5a8.cstep = 0;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600),
              in_stack_fffffffffffff5fc,CONCAT44(in_stack_fffffffffffff5f4,in_stack_00000038),
              (Allocator *)scales);
  local_458 = &local_5a8;
  if (local_5a8.data != (void *)0x0) {
    local_2b8 = local_458;
  }
  if (local_5a8.data != (void *)0x0 && local_5a8.cstep * (long)local_5a8.c != 0) {
    local_28 = *(undefined8 *)(in_stack_00000040 + 0x10);
    local_10 = &local_600;
    local_14 = local_54c;
    local_20 = 4;
    local_600.data = (void *)0x0;
    local_600.refcount = (int *)0x0;
    local_600.elemsize = 0;
    local_600.elempack = 0;
    local_600.allocator = (Allocator *)0x0;
    local_600.dims = 0;
    local_600.w = 0;
    local_600.h = 0;
    local_600.d = 0;
    local_600.c = 0;
    local_600.cstep = 0;
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600),
                in_stack_fffffffffffff5fc,CONCAT44(in_stack_fffffffffffff5f4,in_stack_00000038),
                (Allocator *)scales);
    local_460 = &local_600;
    if (local_600.data != (void *)0x0) {
      local_2b0 = local_460;
    }
    if (local_600.data != (void *)0x0 && local_600.cstep * (long)local_600.c != 0) {
      local_508 = &local_648;
      local_648 = (void *)0x0;
      local_640 = (int *)0x0;
      local_638 = 0;
      local_630 = 0;
      local_628 = (long *)0x0;
      local_620 = 0;
      local_61c = 0;
      local_618 = 0;
      local_614 = 0;
      local_610 = 0;
      local_608 = 0;
      local_649 = false;
      if (3 < (int)local_558._0_4_) {
        iVar1 = cpu_support_x86_avx512_vnni();
        local_8c5 = true;
        if (iVar1 == 0) {
          iVar1 = cpu_support_x86_avx_vnni();
          local_8c5 = iVar1 != 0;
        }
        local_649 = local_8c5;
        iVar1 = cpu_support_x86_avx_vnni_int8();
        if (iVar1 != 0) {
          local_649 = false;
        }
      }
      iVar1 = (int)((ulong)in_stack_fffffffffffff608 >> 0x20);
      if ((local_649 & 1U) == 0) {
        Mat::create(in_stack_fffffffffffff610,iVar1,(int)in_stack_fffffffffffff608,
                    in_stack_fffffffffffff604,
                    CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                    (Allocator *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_00000038));
      }
      else {
        if ((int)local_558._8_4_ < 0x10) {
          if ((int)local_558._8_4_ < 8) {
            if ((int)local_558._8_4_ < 4) {
              local_8dc = 1;
              if (1 < (int)local_558._8_4_) {
                local_8dc = 2;
              }
            }
            else {
              local_8dc = 4;
            }
            local_8d8 = local_8dc;
          }
          else {
            local_8d8 = 8;
          }
          local_8d4 = local_8d8;
        }
        else {
          local_8d4 = 0x10;
        }
        local_650 = local_8d4;
        Mat::create(in_stack_fffffffffffff610,iVar1,(int)in_stack_fffffffffffff608,
                    in_stack_fffffffffffff604,
                    CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                    (Allocator *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_00000038));
      }
      local_468 = &local_648;
      if (local_648 != (void *)0x0) {
        local_2a8 = local_468;
      }
      if (local_648 != (void *)0x0 && local_608 * local_610 != 0) {
        local_54 = local_558._4_4_ * local_558._8_4_;
        local_70 = *(undefined8 *)(in_stack_00000040 + 0x10);
        local_50 = &local_698;
        local_58 = 1;
        local_68 = 4;
        local_698 = (void *)0x0;
        local_690 = (int *)0x0;
        local_688 = 0;
        local_680 = 0;
        local_678 = (long *)0x0;
        local_670 = 0;
        local_66c = 0;
        local_668 = 0;
        local_664 = 0;
        local_660 = 0;
        local_658 = 0;
        Mat::create(in_stack_fffffffffffff610,(int)((ulong)in_stack_fffffffffffff608 >> 0x20),
                    (int)in_stack_fffffffffffff608,in_stack_fffffffffffff604,
                    CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                    (Allocator *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_00000038));
        local_470 = &local_698;
        if (local_698 != (void *)0x0) {
          local_2a0 = local_470;
        }
        if (local_698 != (void *)0x0 && local_658 * local_660 != 0) {
          local_6b8 = local_558._8_4_;
          local_6b4 = local_558._4_4_;
          local_6b0 = local_558._0_4_;
          local_6ac = local_53c;
          local_6a8 = in_stack_00000010;
          local_6a4 = in_stack_00000018;
          local_6a0 = local_544;
          local_69c = local_548;
          for (local_6bc = 0; local_6bc < local_55c; local_6bc = local_6bc + 1) {
            local_6c0 = local_6b8;
            local_6c4 = local_6b4;
            local_6c8 = local_6b0;
            local_6cc = local_6ac;
            local_6d0 = local_6a8;
            local_6d4 = local_6a4;
            local_6d8 = local_6a0;
            local_6dc = local_69c;
            local_6e0 = local_6bc * local_6b8;
            if (local_6a8 == 0) {
              if (*(int *)(local_518 + 0x28) == 3) {
                local_914 = *(int *)(local_518 + 0x38);
              }
              else {
                local_914 = *(int *)(local_518 + 0x30);
              }
              local_910 = local_914 * *(int *)(local_518 + 0x18);
            }
            else {
              local_910 = *(int *)(local_518 + 0x2c);
            }
            local_6e4 = local_910;
            if (local_6a8 == 0) {
              local_91c = *(int *)(local_518 + 0x2c);
            }
            else {
              if (*(int *)(local_518 + 0x28) == 3) {
                local_918 = *(int *)(local_518 + 0x38);
              }
              else {
                local_918 = *(int *)(local_518 + 0x30);
              }
              local_91c = local_918 * *(int *)(local_518 + 0x18);
            }
            local_6e8 = local_91c;
            local_6f0 = local_910 - local_6e0;
            piVar2 = std::min<int>(&local_6f0,&local_6c0);
            local_6ec = *piVar2;
            local_42c = get_omp_thread_num();
            local_420 = &local_738;
            local_428 = &local_698;
            local_280 = (void *)((long)local_698 + local_658 * local_42c * local_688);
            local_268 = &local_738;
            local_730 = (int *)0x0;
            local_728 = local_688;
            local_720 = local_680;
            local_718 = local_678;
            local_70c = local_66c;
            local_708 = local_668;
            local_704 = 1;
            local_700 = local_664;
            local_210 = (long)local_66c * (long)local_668 * local_688;
            local_6f8 = (local_210 + 0xfU & 0xfffffffffffffff0) / local_688;
            local_710 = local_670 + -1;
            if (local_670 == 4) {
              local_6f8 = (long)local_66c * (long)local_668;
            }
            local_214 = 0x10;
            local_26c = local_66c;
            local_270 = local_668;
            local_274 = local_664;
            local_288 = local_688;
            local_28c = local_680;
            local_298 = local_678;
            local_42d = 1;
            local_738 = local_280;
            for (local_73c = 0; local_73c < local_540; local_73c = local_6c4 + local_73c) {
              local_744 = local_540 - local_73c;
              piVar2 = std::min<int>(&local_744,&local_6c4);
              local_740 = *piVar2;
              for (local_748 = 0; local_748 < local_6e8; local_748 = local_6c8 + local_748) {
                local_750 = local_6e8 - local_748;
                piVar2 = std::min<int>(&local_750,&local_6c8);
                local_74c = *piVar2;
                local_44c = get_omp_thread_num();
                local_440 = &local_7e0;
                local_448 = &local_648;
                local_248 = (void *)((long)local_648 + local_608 * local_44c * local_638);
                local_230 = &local_7e0;
                local_220 = (long)local_61c * (long)local_618 * local_638;
                local_40c = local_748 / local_6c8;
                local_400 = &local_798;
                local_408 = &local_7e0;
                local_1f0 = (void *)((long)local_248 + (long)local_61c * (long)local_40c * local_638
                                    );
                local_1e0 = &local_798;
                local_758 = (long)local_61c;
                local_500 = &local_7e0;
                local_134 = local_73c / local_6c4;
                local_128 = &local_870;
                local_dc = *(int *)((long)local_520 + 0x2c);
                local_e0 = (int)local_520[6];
                local_e4 = *(undefined4 *)((long)local_520 + 0x34);
                local_f0 = *local_520 + local_520[8] * (long)local_134 * local_520[2];
                local_f8 = local_520[2];
                local_fc = (undefined4)local_520[3];
                local_108 = (long *)local_520[4];
                local_d8 = &local_870;
                local_c8 = (long)local_dc * (long)local_e0 * local_f8;
                local_b4 = local_748 / local_6c8;
                local_a8 = &local_828;
                local_b0 = &local_870;
                local_88 = (void *)(local_f0 + (long)local_dc * (long)local_b4 * local_f8);
                local_78 = &local_828;
                local_7e8 = (long)local_dc;
                local_4f0 = &local_870;
                local_760 = 1;
                local_764 = 1;
                local_768 = 1;
                local_76c = local_61c;
                local_770 = 2;
                local_778 = local_628;
                local_780 = local_630;
                local_788 = local_638;
                local_790 = (int *)0x0;
                local_7a8 = 0;
                local_7ac = 0;
                local_7b0 = 0;
                local_7b4 = 0;
                local_7c0 = local_628;
                local_7c8 = 0;
                local_7d0 = 0;
                local_7d8 = 0;
                local_7e0 = 0;
                local_7f0 = 1;
                local_7f4 = 1;
                local_7f8 = 1;
                local_800 = 2;
                local_820 = (int *)0x0;
                local_80 = 1;
                local_b8 = 1;
                local_cc = 0x10;
                local_135 = 1;
                local_1e4 = local_61c;
                local_1e8 = 1;
                local_1f8 = local_638;
                local_1fc = local_630;
                local_208 = local_628;
                local_224 = 0x10;
                local_234 = local_61c;
                local_238 = local_618;
                local_23c = local_614;
                local_250 = local_638;
                local_254 = local_630;
                local_260 = local_628;
                local_410 = 1;
                local_44d = 1;
                local_7a0 = 0;
                local_7b8 = 0;
                local_870 = 0;
                local_860 = 0;
                local_858 = 0;
                local_848 = 0;
                local_844 = 0;
                local_840 = 0;
                local_83c = 0;
                local_838 = 0;
                local_830 = 0;
                local_868 = 0;
                local_2e0 = local_4f0;
                local_2c0 = local_500;
                local_a0 = local_108;
                local_94 = local_fc;
                local_90 = local_f8;
                local_7c = local_dc;
                local_850 = local_108;
                local_828 = local_88;
                local_818 = local_f8;
                local_810 = local_fc;
                local_808 = local_108;
                local_7fc = local_dc;
                local_798 = local_1f0;
                if (local_73c == 0) {
                  if (local_748 == 0) {
                    B_scale = (float)((ulong)puVar4 >> 0x20);
                    if (local_6d0 == 0) {
                      compute_A_tile_int8_scales
                                ((Mat *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_00000038),scales
                                 ,B_scale,pMVar3,0,0x1a719a8);
                    }
                    else {
                      transpose_compute_A_tile_int8_scales
                                ((Mat *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_00000038),scales
                                 ,B_scale,pMVar3,0,0x1a71817);
                    }
                  }
                  iVar1 = (int)((ulong)puVar4 >> 0x20);
                  if (local_6d0 == 0) {
                    pMVar3 = &local_5a8;
                    pack_A_tile_quantize
                              ((Mat *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_00000038),scales,
                               iVar1,(int)puVar4,(int)((ulong)pMVar3 >> 0x20),(int)pMVar3,
                               (Mat *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600))
                    ;
                  }
                  else {
                    pMVar3 = &local_5a8;
                    transpose_pack_A_tile_quantize
                              ((Mat *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_00000038),scales,
                               iVar1,(int)puVar4,(int)((ulong)pMVar3 >> 0x20),(int)pMVar3,
                               (Mat *)CONCAT44(in_stack_fffffffffffff604,in_stack_fffffffffffff600))
                    ;
                  }
                }
                scales = (Mat *)CONCAT44((int)((ulong)scales >> 0x20),local_74c);
                puVar4 = (undefined1 *)CONCAT44((int)((ulong)puVar4 >> 0x20),local_748);
                pMVar3 = (Mat *)CONCAT44((int)((ulong)pMVar3 >> 0x20),local_740);
                gemm_transB_packed_tile_int8
                          (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000074,
                           in_stack_00000070,in_stack_0000006c,in_stack_00002100,in_stack_00002108,
                           in_stack_00002110);
                ppvVar5 = &local_828;
                local_4e0 = ppvVar5;
                local_300 = ppvVar5;
                if (local_820 != (int *)0x0) {
                  local_304 = 0xffffffff;
                  LOCK();
                  local_308 = *local_820;
                  *local_820 = *local_820 + -1;
                  UNLOCK();
                  if (local_308 == 1) {
                    if (local_808 == (long *)0x0) {
                      local_1b8 = local_828;
                      if (local_828 != (void *)0x0) {
                        free(local_828);
                      }
                    }
                    else {
                      (**(code **)(*local_808 + 0x18))(local_808,local_828);
                    }
                  }
                }
                *ppvVar5 = (void *)0x0;
                ppvVar5[2] = (void *)0x0;
                *(undefined4 *)(ppvVar5 + 3) = 0;
                *(undefined4 *)(ppvVar5 + 5) = 0;
                *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
                *(undefined4 *)(ppvVar5 + 6) = 0;
                *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
                *(undefined4 *)(ppvVar5 + 7) = 0;
                ppvVar5[8] = (void *)0x0;
                ppvVar5[1] = (void *)0x0;
                ppvVar5 = &local_798;
                local_4d0 = ppvVar5;
                local_320 = ppvVar5;
                if (local_790 != (int *)0x0) {
                  local_324 = 0xffffffff;
                  LOCK();
                  local_328 = *local_790;
                  *local_790 = *local_790 + -1;
                  UNLOCK();
                  if (local_328 == 1) {
                    if (local_778 == (long *)0x0) {
                      local_1a8 = local_798;
                      if (local_798 != (void *)0x0) {
                        free(local_798);
                      }
                    }
                    else {
                      (**(code **)(*local_778 + 0x18))(local_778,local_798);
                    }
                  }
                }
                *ppvVar5 = (void *)0x0;
                ppvVar5[2] = (void *)0x0;
                *(undefined4 *)(ppvVar5 + 3) = 0;
                *(undefined4 *)(ppvVar5 + 5) = 0;
                *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
                *(undefined4 *)(ppvVar5 + 6) = 0;
                *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
                *(undefined4 *)(ppvVar5 + 7) = 0;
                ppvVar5[8] = (void *)0x0;
                ppvVar5[1] = (void *)0x0;
              }
              scales = &local_600;
              puVar4 = (undefined1 *)CONCAT44((int)((ulong)puVar4 >> 0x20),local_740);
              pMVar3 = (Mat *)CONCAT44((int)((ulong)pMVar3 >> 0x20),local_73c);
              in_stack_00000038 = local_6d4;
              unpack_output_tile_dequantize
                        (in_stack_fffffffffffff618,in_stack_fffffffffffff610,
                         in_stack_fffffffffffff608,in_stack_fffffffffffff604,
                         in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,
                         in_stack_fffffffffffff630,(int)in_stack_fffffffffffff638,
                         in_stack_fffffffffffff640,in_stack_fffffffffffff5f8,
                         in_stack_fffffffffffff5f4,(int)in_stack_fffffffffffff648);
            }
            in_stack_fffffffffffff648 = &local_738;
            local_4c0 = in_stack_fffffffffffff648;
            local_340 = in_stack_fffffffffffff648;
            if (local_730 != (int *)0x0) {
              local_344 = 0xffffffff;
              LOCK();
              local_348 = *local_730;
              *local_730 = *local_730 + -1;
              UNLOCK();
              if (local_348 == 1) {
                if (local_718 == (long *)0x0) {
                  local_198 = local_738;
                  if (local_738 != (void *)0x0) {
                    free(local_738);
                  }
                }
                else {
                  (**(code **)(*local_718 + 0x18))(local_718,local_738);
                }
              }
            }
            *in_stack_fffffffffffff648 = (void *)0x0;
            in_stack_fffffffffffff648[2] = (void *)0x0;
            *(undefined4 *)(in_stack_fffffffffffff648 + 3) = 0;
            *(undefined4 *)(in_stack_fffffffffffff648 + 5) = 0;
            *(undefined4 *)((long)in_stack_fffffffffffff648 + 0x2c) = 0;
            *(undefined4 *)(in_stack_fffffffffffff648 + 6) = 0;
            *(undefined4 *)((long)in_stack_fffffffffffff648 + 0x34) = 0;
            *(undefined4 *)(in_stack_fffffffffffff648 + 7) = 0;
            in_stack_fffffffffffff648[8] = (void *)0x0;
            in_stack_fffffffffffff648[1] = (void *)0x0;
          }
          local_50c = 0;
        }
        else {
          local_50c = -100;
        }
        local_5b8 = 1;
        ppvVar5 = &local_698;
        local_4b0 = ppvVar5;
        local_360 = ppvVar5;
        if (local_690 != (int *)0x0) {
          local_364 = 0xffffffff;
          LOCK();
          local_368 = *local_690;
          *local_690 = *local_690 + -1;
          UNLOCK();
          if (local_368 == 1) {
            if (local_678 == (long *)0x0) {
              local_188 = local_698;
              if (local_698 != (void *)0x0) {
                free(local_698);
              }
            }
            else {
              (**(code **)(*local_678 + 0x18))(local_678,local_698);
            }
          }
        }
        *ppvVar5 = (void *)0x0;
        ppvVar5[2] = (void *)0x0;
        *(undefined4 *)(ppvVar5 + 3) = 0;
        *(undefined4 *)(ppvVar5 + 5) = 0;
        *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
        *(undefined4 *)(ppvVar5 + 6) = 0;
        *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
        *(undefined4 *)(ppvVar5 + 7) = 0;
        ppvVar5[8] = (void *)0x0;
        ppvVar5[1] = (void *)0x0;
      }
      else {
        local_50c = -100;
        local_5b8 = 1;
      }
      local_4a0 = &local_648;
      local_380 = local_4a0;
      if (local_640 != (int *)0x0) {
        local_384 = 0xffffffff;
        LOCK();
        local_388 = *local_640;
        *local_640 = *local_640 + -1;
        UNLOCK();
        if (local_388 == 1) {
          if (local_628 == (long *)0x0) {
            local_178 = local_648;
            if (local_648 != (void *)0x0) {
              free(local_648);
            }
          }
          else {
            (**(code **)(*local_628 + 0x18))(local_628,local_648);
          }
        }
      }
      local_648 = (void *)0x0;
      local_638 = 0;
      local_630 = 0;
      local_620 = 0;
      local_61c = 0;
      local_618 = 0;
      local_614 = 0;
      local_610 = 0;
      local_608 = 0;
      local_640 = (int *)0x0;
    }
    else {
      local_50c = -100;
      local_5b8 = 1;
    }
    pMVar3 = &local_600;
    local_490 = pMVar3;
    local_3a0 = pMVar3;
    if (local_600.refcount != (int *)0x0) {
      local_3a4 = 0xffffffff;
      LOCK();
      local_3a8 = *local_600.refcount;
      *local_600.refcount = *local_600.refcount + -1;
      UNLOCK();
      if (local_3a8 == 1) {
        if (local_600.allocator == (Allocator *)0x0) {
          local_168 = local_600.data;
          if (local_600.data != (void *)0x0) {
            free(local_600.data);
          }
        }
        else {
          (*(local_600.allocator)->_vptr_Allocator[3])(local_600.allocator,local_600.data);
        }
      }
    }
    pMVar3->data = (void *)0x0;
    pMVar3->elemsize = 0;
    pMVar3->elempack = 0;
    pMVar3->dims = 0;
    pMVar3->w = 0;
    pMVar3->h = 0;
    pMVar3->d = 0;
    pMVar3->c = 0;
    pMVar3->cstep = 0;
    pMVar3->refcount = (int *)0x0;
  }
  else {
    local_50c = -100;
    local_5b8 = 1;
  }
  pMVar3 = &local_5a8;
  if (local_5a8.refcount != (int *)0x0) {
    local_3c4 = 0xffffffff;
    LOCK();
    local_3c8 = *local_5a8.refcount;
    *local_5a8.refcount = *local_5a8.refcount + -1;
    UNLOCK();
    if (local_3c8 == 1) {
      local_480 = pMVar3;
      local_3c0 = pMVar3;
      if (local_5a8.allocator == (Allocator *)0x0) {
        local_158 = local_5a8.data;
        if (local_5a8.data != (void *)0x0) {
          free(local_5a8.data);
        }
      }
      else {
        (*(local_5a8.allocator)->_vptr_Allocator[3])(local_5a8.allocator,local_5a8.data);
      }
    }
  }
  pMVar3->data = (void *)0x0;
  pMVar3->elemsize = 0;
  pMVar3->elempack = 0;
  pMVar3->dims = 0;
  pMVar3->w = 0;
  pMVar3->h = 0;
  pMVar3->d = 0;
  pMVar3->c = 0;
  pMVar3->cstep = 0;
  pMVar3->refcount = (int *)0x0;
  return local_50c;
}

Assistant:

static int gemm_BT_x86_int8(const Mat& A, const Mat& BT, float B_int8_scale, const Mat& C, Mat& top_blob, int broadcast_type_C, int N, int K, int transA, int output_transpose, float alpha, float beta, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    // NCNN_LOGE("gemm_BT_x86_int8");

    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk_int8(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    // int nn_N = (N + TILE_N - 1) / TILE_N;

    Mat A_int8_scales(M, 4u, opt.workspace_allocator);
    if (A_int8_scales.empty())
        return -100;

    // const float output_descale = 1.f / (A_int8_scale * B_int8_scale);
    Mat output_descales(M, 4u, opt.workspace_allocator);
    if (output_descales.empty())
        return -100;

    // NCNN_LOGE("scale %.4f  %.4f", A_int8_scale, B_int8_scale);

    Mat ATX;
#if NCNN_AVX512VNNI || NCNN_AVXVNNI
    bool has_w_shift = false;
    if (TILE_K >= 4)
    {
        has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
        if (ncnn::cpu_support_x86_avx_vnni_int8())
            has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
    }
    if (has_w_shift)
    {
        int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
        ATX.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 1u, opt.workspace_allocator);
    }
    else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
    {
        ATX.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 1u, opt.workspace_allocator);
    }
    if (ATX.empty())
        return -100;

    Mat topT(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (topT.empty())
        return -100;

    const struct gemm_x86_int8_omp_args args = {TILE_M, TILE_N, TILE_K, broadcast_type_C, transA, output_transpose, alpha, beta};

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        // shadowed variable for less openmp task args
        const int TILE_M = args.TILE_M;
        const int TILE_N = args.TILE_N;
        const int TILE_K = args.TILE_K;
        const int broadcast_type_C = args.broadcast_type_C;
        const int transA = args.transA;
        const int output_transpose = args.output_transpose;
        const float alpha = args.alpha;
        const float beta = args.beta;
        // const int input_elemtype = args.input_elemtype;
        // const int output_elemtype = args.output_elemtype;

        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (k == 0)
                    {
                        if (transA)
                            transpose_compute_A_tile_int8_scales(A, A_int8_scales, B_int8_scale, output_descales, i, max_ii);
                        else
                            compute_A_tile_int8_scales(A, A_int8_scales, B_int8_scale, output_descales, i, max_ii);

                        // NCNN_LOGE("A_int8_scales %f  B_int8_scale %f", A_int8_scales[0], B_int8_scale);
                    }

                    if (transA)
                        transpose_pack_A_tile_quantize(A, AT_tile, i, max_ii, k, max_kk, A_int8_scales);
                    else
                        pack_A_tile_quantize(A, AT_tile, i, max_ii, k, max_kk, A_int8_scales);
                }

                gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
            }

            unpack_output_tile_dequantize(topT_tile, C, top_blob, broadcast_type_C, i, max_ii, j, max_jj, output_descales, alpha, beta, output_transpose);
        }
    }

    return 0;
}